

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.cpp
# Opt level: O1

int __thiscall CJobPool::Init(CJobPool *this,int NumThreads)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  
  iVar1 = 0x20;
  if (NumThreads < 0x20) {
    iVar1 = NumThreads;
  }
  this->m_NumThreads = iVar1;
  if (0 < NumThreads) {
    lVar3 = 0;
    do {
      pvVar2 = thread_init(WorkerThread,this);
      this->m_apThreads[lVar3] = pvVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->m_NumThreads);
  }
  return 0;
}

Assistant:

int CJobPool::Init(int NumThreads)
{
	// start threads
	m_NumThreads = NumThreads > MAX_THREADS ? MAX_THREADS : NumThreads;
	for(int i = 0; i < m_NumThreads; i++)
		m_apThreads[i] = thread_init(WorkerThread, this);
	return 0;
}